

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale_tools.cpp
# Opt level: O0

QSimpleParsedNumber<long_long> qstrntoll(char *begin,qsizetype size,int base)

{
  long lVar1;
  QSimpleParsedNumber<long_long> QVar2;
  bool bVar3;
  longlong *__value;
  longlong *__last;
  longlong lVar4;
  char *in_RSI;
  longlong *in_RDI;
  long in_FS_OFFSET;
  R_conflict1 RVar5;
  __integer_from_chars_result_type<long_long> _Var6;
  __integer_from_chars_result_type<unsigned_long_long> _Var7;
  bool negate;
  char *stop;
  char *p;
  unsigned_long_long check;
  __integer_from_chars_result_type<long_long> res;
  longlong result;
  R_conflict1 prefix;
  undefined2 in_stack_ffffffffffffff54;
  char in_stack_ffffffffffffff56;
  undefined1 in_stack_ffffffffffffff57;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  char *in_stack_ffffffffffffff60;
  undefined8 in_stack_ffffffffffffff68;
  int __base;
  unsigned_long_long *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7c;
  undefined1 uVar8;
  undefined1 uVar9;
  byte bVar10;
  longlong local_58;
  long local_50;
  long local_38;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __value = (longlong *)((long)in_RDI + (long)in_RSI);
  __last = in_RDI;
  while( true ) {
    uVar9 = false;
    if (__last < __value) {
      uVar9 = ascii_isspace('\0');
    }
    __base = (int)((ulong)in_stack_ffffffffffffff68 >> 0x20);
    if ((bool)uVar9 == false) break;
    __last = (longlong *)((long)__last + 1);
  }
  uVar8 = false;
  if (__last < __value) {
    uVar8 = (char)*__last == '-';
  }
  if (((bool)uVar8 != false) || ((__last < __value && ((char)*__last == '+')))) {
    __last = (longlong *)((long)__last + 1);
  }
  bVar10 = uVar8;
  RVar5 = scanPrefix(in_stack_ffffffffffffff60,
                     (char *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                     CONCAT13(in_stack_ffffffffffffff57,
                              CONCAT12(in_stack_ffffffffffffff56,in_stack_ffffffffffffff54)));
  if (((RVar5.base == 0) || (__value <= RVar5.next)) ||
     (bVar3 = isDigitForBase(in_stack_ffffffffffffff56,in_stack_ffffffffffffff5c), !bVar3)) {
    local_58 = 0;
    local_50 = 0;
  }
  else {
    _Var6 = std::from_chars<long_long>
                      (in_RSI,(char *)__last,__value,
                       CONCAT13(bVar10,CONCAT12(uVar9,CONCAT11(uVar8,in_stack_ffffffffffffff7c))));
    if (((bVar10 & 1) == 0) || (_Var6.ec != result_out_of_range)) {
      if (_Var6.ec == 0) {
        local_58 = 0;
        local_50 = (long)_Var6.ptr - (long)in_RDI;
      }
      else {
        local_58 = 0;
        local_50 = 0;
      }
    }
    else {
      local_38 = 0;
      _Var7 = std::from_chars<unsigned_long_long>
                        ((char *)__last,
                         (char *)CONCAT17(bVar10,CONCAT16(uVar9,CONCAT15(uVar8,CONCAT14(
                                                  in_stack_ffffffffffffff7c,
                                                  in_stack_ffffffffffffff78)))),
                         in_stack_ffffffffffffff70,__base);
      if ((_Var7.ec == 0) && (lVar4 = std::numeric_limits<long_long>::min(), local_38 + lVar4 == 0))
      {
        local_58 = std::numeric_limits<long_long>::min();
        local_50 = (long)_Var7.ptr - (long)in_RDI;
      }
      else {
        local_58 = 0;
        local_50 = 0;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    QVar2.used._0_4_ = (int)local_50;
    QVar2.result = local_58;
    QVar2.used._4_4_ = (int)((ulong)local_50 >> 0x20);
    return QVar2;
  }
  __stack_chk_fail();
}

Assistant:

QSimpleParsedNumber<qlonglong> qstrntoll(const char *begin, qsizetype size, int base)
{
    const char *p = begin, *const stop = begin + size;
    while (p < stop && ascii_isspace(*p))
        ++p;
    // Frustratingly, std::from_chars() doesn't cope with a 0x prefix that might
    // be between the sign and digits, so we have to handle that for it, which
    // means we can't use its ability to read LLONG_MIN directly; see below.
    const bool negate = p < stop && *p == '-';
    if (negate || (p < stop && *p == '+'))
        ++p;

    const auto prefix = scanPrefix(p, stop, base);
    // Must check for digit, as from_chars() will accept a sign, which would be
    // a second sign, that we should reject.
    if (!prefix.base || prefix.next >= stop || !isDigitForBase(*prefix.next, prefix.base))
        return { };

    long long result = 0;
    auto res = std::from_chars(prefix.next, stop, result, prefix.base);
    if (negate && res.ec == std::errc::result_out_of_range) {
        // Maybe LLONG_MIN:
        unsigned long long check = 0;
        res = std::from_chars(prefix.next, stop, check, prefix.base);
        if (res.ec == std::errc{} && check + std::numeric_limits<long long>::min() == 0)
            return { std::numeric_limits<long long>::min(), res.ptr - begin };
        return { };
    }
    if (res.ec != std::errc{})
        return { };
    return { negate ? -result : result, res.ptr - begin };
}